

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

CollSeq * sqlite3ExprCollSeq(Parse *pParse,Expr *pExpr)

{
  u8 uVar1;
  sqlite3 *db;
  Expr *pEVar2;
  ExprList *pEVar3;
  ExprList_item *pEVar4;
  CollSeq *pColl;
  char *zName;
  CollSeq *pCVar5;
  ulong uVar6;
  Expr *pEVar7;
  long lVar8;
  
  db = pParse->db;
LAB_00147d9e:
  do {
    pEVar7 = pExpr;
    if (pEVar7 == (Expr *)0x0) {
      return (CollSeq *)0x0;
    }
    uVar1 = pEVar7->op;
    if (uVar1 == 0xb0) {
      uVar1 = pEVar7->op2;
    }
    if (uVar1 == '$') {
LAB_00147e7a:
      pEVar4 = (ExprList_item *)&pEVar7->pLeft;
    }
    else {
      if (((uVar1 == 'M') || (uVar1 == 0xa7)) || (uVar1 == 0xa9)) {
        if ((pEVar7->y).pTab != (Table *)0x0) {
          if ((long)pEVar7->iColumn < 0) {
            return (CollSeq *)0x0;
          }
          zName = sqlite3ColumnColl(((pEVar7->y).pTab)->aCol + pEVar7->iColumn);
          pColl = sqlite3FindCollSeq(db,db->enc,zName,0);
          goto LAB_00147ed6;
        }
joined_r0x00147df0:
        if (uVar1 == 'q') {
          pColl = sqlite3GetCollSeq(pParse,db->enc,(CollSeq *)0x0,(pEVar7->u).zToken);
LAB_00147ed6:
          if (pColl == (CollSeq *)0x0) {
            return (CollSeq *)0x0;
          }
          if (pColl->xCmp == (_func_int_void_ptr_int_void_ptr_int_void_ptr *)0x0) {
            pCVar5 = sqlite3GetCollSeq(pParse,pParse->db->enc,pColl,pColl->zName);
            if (pCVar5 == (CollSeq *)0x0) {
              return (CollSeq *)0x0;
            }
            return pColl;
          }
          return pColl;
        }
        if ((pEVar7->flags & 0x200) == 0) {
          return (CollSeq *)0x0;
        }
        pExpr = pEVar7->pLeft;
        if ((pExpr == (Expr *)0x0) || ((pExpr->flags & 0x200) == 0)) {
          pEVar2 = pEVar7->pRight;
          pEVar3 = (pEVar7->x).pList;
          pExpr = pEVar2;
          if ((pEVar3 != (ExprList *)0x0) && (db->mallocFailed == '\0')) {
            uVar6 = (ulong)(uint)pEVar3->nExpr;
            if (pEVar3->nExpr < 1) {
              uVar6 = 0;
            }
            lVar8 = 0;
            do {
              pExpr = pEVar2;
              if (uVar6 * 0x18 + 0x18 == lVar8 + 0x18) break;
              pExpr = *(Expr **)((long)&pEVar3->a[0].pExpr + lVar8);
              lVar8 = lVar8 + 0x18;
            } while ((pExpr->flags & 0x200) == 0);
          }
        }
        goto LAB_00147d9e;
      }
      if (uVar1 == 0xae) goto LAB_00147e7a;
      if (uVar1 != 0xb1) goto joined_r0x00147df0;
      pEVar4 = ((pEVar7->x).pList)->a;
    }
    pExpr = pEVar4->pExpr;
  } while( true );
}

Assistant:

SQLITE_PRIVATE CollSeq *sqlite3ExprCollSeq(Parse *pParse, const Expr *pExpr){
  sqlite3 *db = pParse->db;
  CollSeq *pColl = 0;
  const Expr *p = pExpr;
  while( p ){
    int op = p->op;
    if( op==TK_REGISTER ) op = p->op2;
    if( op==TK_AGG_COLUMN || op==TK_COLUMN || op==TK_TRIGGER ){
      assert( ExprUseYTab(p) );
      if( p->y.pTab!=0 ){
        /* op==TK_REGISTER && p->y.pTab!=0 happens when pExpr was originally
        ** a TK_COLUMN but was previously evaluated and cached in a register */
        int j = p->iColumn;
        if( j>=0 ){
          const char *zColl = sqlite3ColumnColl(&p->y.pTab->aCol[j]);
          pColl = sqlite3FindCollSeq(db, ENC(db), zColl, 0);
        }
        break;
      }
    }
    if( op==TK_CAST || op==TK_UPLUS ){
      p = p->pLeft;
      continue;
    }
    if( op==TK_VECTOR ){
      assert( ExprUseXList(p) );
      p = p->x.pList->a[0].pExpr;
      continue;
    }
    if( op==TK_COLLATE ){
      assert( !ExprHasProperty(p, EP_IntValue) );
      pColl = sqlite3GetCollSeq(pParse, ENC(db), 0, p->u.zToken);
      break;
    }
    if( p->flags & EP_Collate ){
      if( p->pLeft && (p->pLeft->flags & EP_Collate)!=0 ){
        p = p->pLeft;
      }else{
        Expr *pNext  = p->pRight;
        /* The Expr.x union is never used at the same time as Expr.pRight */
        assert( ExprUseXList(p) );
        assert( p->x.pList==0 || p->pRight==0 );
        if( p->x.pList!=0 && !db->mallocFailed ){
          int i;
          for(i=0; ALWAYS(i<p->x.pList->nExpr); i++){
            if( ExprHasProperty(p->x.pList->a[i].pExpr, EP_Collate) ){
              pNext = p->x.pList->a[i].pExpr;
              break;
            }
          }
        }
        p = pNext;
      }
    }else{
      break;
    }
  }
  if( sqlite3CheckCollSeq(pParse, pColl) ){
    pColl = 0;
  }
  return pColl;
}